

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O2

void __thiscall cppcms::widgets::numeric<int>::~numeric(numeric<int> *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->super_base_html_input + *(long *)((long)pvVar1 + -0x18)) = vtt[3];
  std::__cxx11::string::~string((string *)&this->loaded_string_);
  cppcms::widgets::base_html_input::~base_html_input(&this->super_base_html_input);
  return;
}

Assistant:

numeric() :
				base_html_input("text"),
				check_low_(false),
				check_high_(false),
				non_empty_(false)
			{
			}